

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O3

void __thiscall estl::weak_ptr<MyClass>::decrease_control_block_counter(weak_ptr<MyClass> *this)

{
  use_counter_type *puVar1;
  control_block *this_00;
  
  if (this->control_block_ptr_ != (control_block *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"control decrease ",0x11);
    shared_ptr<MyClass>::control_block::dbg(this->control_block_ptr_);
    LOCK();
    puVar1 = &this->control_block_ptr_->control_block_count_;
    (puVar1->super___atomic_base<unsigned_int>)._M_i =
         (puVar1->super___atomic_base<unsigned_int>)._M_i - 1;
    UNLOCK();
    if ((puVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
      this_00 = this->control_block_ptr_;
      if (this_00 != (control_block *)0x0) {
        shared_ptr<MyClass>::control_block::~control_block(this_00);
      }
      operator_delete(this_00,8);
      this->control_block_ptr_ = (control_block *)0x0;
    }
  }
  return;
}

Assistant:

void decrease_control_block_counter()
    {
        if (!control_block_ptr_) {
            return;
        }
        std::cerr << "control decrease "; control_block_ptr_->dbg();
        if (--(control_block_ptr_->control_block_count_) == 0) {
            delete control_block_ptr_;
            control_block_ptr_ = nullptr;
        }
    }